

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkSharePrint(Abc_ShaMan_t *p)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  void *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  size_t __size;
  
  __size = (long)p->vObj2Lit->nSize + 1;
  __ptr = malloc(__size);
  __ptr_00 = calloc(__size,4);
  pVVar5 = p->vBuckets;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar7];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar10 = 0;
        do {
          lVar3 = *(long *)(*(long *)((long)pvVar2 + 8) + lVar10 * 8);
          pVVar4 = p->vObj2Lit;
          if (pVVar4->nSize < 1) {
            lVar6 = 0;
          }
          else {
            lVar6 = 0;
            do {
              *(undefined1 *)((long)__ptr + lVar6) = 0x30;
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar4->nSize);
          }
          *(undefined1 *)((long)__ptr + lVar6) = 0;
          iVar8 = *(int *)(lVar3 + 4);
          if (2 < iVar8) {
            lVar6 = 2;
            do {
              iVar8 = *(int *)(*(long *)(lVar3 + 8) + lVar6 * 4);
              if (pVVar4->nSize <= iVar8) {
                __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                              ,0x180,"void Abc_NtkSharePrint(Abc_ShaMan_t *)");
              }
              piVar1 = (int *)((long)__ptr_00 + (long)iVar8 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined1 *)((long)__ptr + (long)iVar8) = 0x31;
              lVar6 = lVar6 + 1;
              iVar8 = *(int *)(lVar3 + 4);
            } while (lVar6 < iVar8);
          }
          if ((iVar8 < 1) || (iVar8 == 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%4d%3d: %s\n",(ulong)**(uint **)(lVar3 + 8),(ulong)(*(uint **)(lVar3 + 8))[1],
                 __ptr);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar2 + 4));
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vBuckets;
    } while (lVar7 < pVVar5->nSize);
  }
  if (0 < p->vObj2Lit->nSize) {
    uVar11 = 0;
    do {
      if (0 < *(int *)((long)__ptr_00 + uVar11 * 4)) {
        printf("%d=%d ",uVar11 & 0xffffffff);
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->vObj2Lit->nSize);
  }
  putchar(10);
  if ((long)p->nStartCols < 1) {
    uVar9 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    do {
      uVar9 = (uVar9 + *(int *)((long)__ptr_00 + lVar7 * 4)) - 1;
      lVar7 = lVar7 + 1;
    } while (p->nStartCols != lVar7);
  }
  printf("Total = %d.  ",(ulong)uVar9);
  printf("Gates = %d.\n",(ulong)((uVar9 + p->vObj2Lit->nSize) - p->nStartCols));
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  printf("Bucket contents: ");
  pVVar5 = p->vBuckets;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      printf("%d ",(ulong)*(uint *)((long)pVVar5->pArray[lVar7] + 4));
      lVar7 = lVar7 + 1;
      pVVar5 = p->vBuckets;
    } while (lVar7 < pVVar5->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkSharePrint( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput;
    int i, k, j, ObjId;
    char * pBuffer = ABC_ALLOC( char, Vec_IntSize(p->vObj2Lit) + 1 );
    int * pCounters = ABC_CALLOC( int, Vec_IntSize(p->vObj2Lit) + 1 );
    int nTotal = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        for ( k = 0; k < Vec_IntSize(p->vObj2Lit); k++ )
            pBuffer[k] = '0';
        pBuffer[k] = 0;

        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            pBuffer[ObjId] = '1';
            pCounters[ObjId]++;
        }
        printf( "%4d%3d: %s\n", Vec_IntEntry(vInput, 0), Vec_IntEntry(vInput, 1), pBuffer );
    }

    for ( i = 0; i < Vec_IntSize(p->vObj2Lit); i++ )
        if ( pCounters[i] > 0 )
            printf( "%d=%d ", i, pCounters[i] ); 
    printf( "\n" );

    nTotal = 0;
    for ( i = 0; i < p->nStartCols; i++ )
        nTotal += pCounters[i] - 1;
    printf( "Total = %d.  ", nTotal );
    printf( "Gates = %d.\n", Vec_IntSize(p->vObj2Lit) - p->nStartCols + nTotal );

    ABC_FREE( pCounters );
    ABC_FREE( pBuffer );

    printf( "Bucket contents: " );
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        printf( "%d ", Vec_PtrSize(vBucket) );
    printf( "\n" );
}